

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O3

int __thiscall mpt::pipe<char>::pipe(pipe<char> *this,int *__pipedes)

{
  instance *piVar1;
  undefined8 in_RAX;
  reference<mpt::pipe<char>::instance> *prVar2;
  long in_RDX;
  undefined8 uStack_28;
  
  (this->_d)._ref = (instance *)0x0;
  if (0 < in_RDX) {
    uStack_28 = in_RAX;
    prVar2 = ref(this);
    in_RAX = (**(code **)(*(long *)&prVar2->_ref->super_type + 0x40))();
    do {
      piVar1 = (this->_d)._ref;
      if (piVar1 != (instance *)0x0) {
        uStack_28 = CONCAT17((char)*__pipedes,(undefined7)uStack_28);
        in_RAX = (**(code **)(*(long *)&piVar1->super_type + 0x48))(piVar1,(long)&uStack_28 + 7,1);
      }
      in_RDX = in_RDX + -1;
    } while (in_RDX != 0);
  }
  return (int)in_RAX;
}

Assistant:

bool pop(T *data = 0) const
	{
		io::queue *d;
		if (!(d = _d.instance())) {
			return false;
		}
		uint8_t buf[sizeof(T)];
		T *t = static_cast<T *>(static_cast<void *>(buf));
		if (!d->pop(t, sizeof(T))) {
			return false;
		}
		if (data) {
			*data = *t;
		} else {
			t->~T();
		}
		return true;
	}